

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Uint64(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         *this,uint64_t u64)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  char *pcVar1;
  char *buffer;
  
  Prefix(this,kNumberType);
  this_00 = &this->os_->stack_;
  buffer = this_00->stackTop_;
  if ((long)this_00->stackEnd_ - (long)buffer < 0x14) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,0x14);
    buffer = this_00->stackTop_;
  }
  this_00->stackTop_ = buffer + 0x14;
  pcVar1 = internal::u64toa(u64,buffer);
  (this->os_->stack_).stackTop_ =
       pcVar1 + (long)((this->os_->stack_).stackTop_ + (-0x14 - (long)buffer));
  return true;
}

Assistant:

bool Uint64(uint64_t u64)   { Prefix(kNumberType); return EndValue(WriteUint64(u64)); }